

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpgradeAI.cpp
# Opt level: O2

void __thiscall tiger::trains::ai::UpgradeAI::step(UpgradeAI *this)

{
  vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
  *this_00;
  pointer ppVar1;
  pointer ppVar2;
  IUpgradeble *pIVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  iVar4 = world::Town::getArrmor(this->town);
  this_00 = (this->upgradeQueue).c.
            super__Deque_base<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->upgradeQueue).c.
      super__Deque_base<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == this_00) {
    return;
  }
  uVar7 = 0;
  do {
    uVar8 = (ulong)uVar7;
    while( true ) {
      ppVar1 = (this_00->
               super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (this_00->
               super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)ppVar2 - (long)ppVar1 >> 4) <= uVar8) {
        if (ppVar1 != ppVar2) {
          return;
        }
        std::
        deque<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>
        ::pop_front(&(this->upgradeQueue).c);
        return;
      }
      pIVar3 = ppVar1[uVar8].first;
      iVar6 = ppVar1[uVar8].second;
      iVar5 = (*pIVar3->_vptr_IUpgradeble[2])(pIVar3);
      if (((iVar5 + 1 != iVar6) ||
          (iVar6 = (*pIVar3->_vptr_IUpgradeble[3])(pIVar3), iVar4 - this->RESERV_ARMOR <= iVar6)) ||
         (iVar6 = (*pIVar3->_vptr_IUpgradeble[5])(pIVar3), (char)iVar6 == '\0')) break;
      (*pIVar3->_vptr_IUpgradeble[4])(pIVar3);
      iVar6 = (*pIVar3->_vptr_IUpgradeble[3])(pIVar3);
      iVar4 = iVar4 - iVar6;
      std::
      vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
      ::erase(this_00,(this_00->
                      super__Vector_base<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar8);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void UpgradeAI::step()
{
    int ar = town->getArrmor();

    if (upgradeQueue.empty())
        return;

    std::vector<std::pair<world::IUpgradeble *, int>> &upgradeVector = upgradeQueue.front();

    int i = 0;

    while (i < upgradeVector.size())
    {
        world::IUpgradeble *target = upgradeVector[i].first;
        int level = upgradeVector[i].second;

        if (target->getLevel() + 1 == level &&
                target->getNextLevelPrice() < ar - RESERV_ARMOR &&
                target->isReadyToUpgrade())
        {
            target->upgrade();
            ar -= target->getNextLevelPrice();
            upgradeVector.erase(upgradeVector.begin() + i);
        }
        else
            i++;
    }

    if (upgradeVector.empty())
        upgradeQueue.pop();

}